

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9VmInitFuncState(jx9_vm *pVm,jx9_vm_func *pFunc,char *zName,sxu32 nByte,sxi32 iFlags,
                        void *pUserData)

{
  void *pUserData_local;
  sxi32 iFlags_local;
  sxu32 nByte_local;
  char *zName_local;
  jx9_vm_func *pFunc_local;
  jx9_vm *pVm_local;
  
  SyZero(pFunc,0xb0);
  SySetInit(&pFunc->aArgs,&pVm->sAllocator,0x40);
  SySetInit(&pFunc->aStatic,&pVm->sAllocator,0x40);
  SySetInit(&pFunc->aByteCode,&pVm->sAllocator,0x18);
  SySetAlloc(&pFunc->aByteCode,0x10);
  pFunc->iFlags = iFlags;
  pFunc->pUserData = pUserData;
  (pFunc->sName).zString = zName;
  (pFunc->sName).nByte = nByte;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmInitFuncState(
	jx9_vm *pVm,        /* Target VM */
	jx9_vm_func *pFunc, /* Target Fucntion */
	const char *zName,  /* Function name */
	sxu32 nByte,        /* zName length */
	sxi32 iFlags,       /* Configuration flags */
	void *pUserData     /* Function private data */
	)
{
	/* Zero the structure */
	SyZero(pFunc, sizeof(jx9_vm_func));	
	/* Initialize structure fields */
	/* Arguments container */
	SySetInit(&pFunc->aArgs, &pVm->sAllocator, sizeof(jx9_vm_func_arg));
	/* Static variable container */
	SySetInit(&pFunc->aStatic, &pVm->sAllocator, sizeof(jx9_vm_func_static_var));
	/* Bytecode container */
	SySetInit(&pFunc->aByteCode, &pVm->sAllocator, sizeof(VmInstr));
    /* Preallocate some instruction slots */
	SySetAlloc(&pFunc->aByteCode, 0x10);
	pFunc->iFlags = iFlags;
	pFunc->pUserData = pUserData;
	SyStringInitFromBuf(&pFunc->sName, zName, nByte);
	return SXRET_OK;
}